

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O2

void __thiscall
Transaction_AddTxIn_RemoveTxIn_Test::TestBody(Transaction_AddTxIn_RemoveTxIn_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_1e8;
  AssertionResult gtest_ar;
  AssertHelper local_1c0 [4];
  Transaction tx;
  Script script;
  AbstractTxInReference local_128;
  AbstractTxInReference local_98;
  
  cfd::core::Transaction::Transaction(&tx,2,0);
  std::__cxx11::string::string
            ((string *)&gtest_ar,"1600141c673dd706e05b17e5c9ff033c8619d06098d7ac",
             (allocator *)local_1c0);
  cfd::core::Script::Script(&script,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)local_1c0,
                 "306186bd70e56d820508ed3c9fd656ecb4b4ead0b1502fc3349145df5a15b7e9",
                 (allocator *)&local_1e8);
      cfd::core::Txid::Txid((Txid *)&gtest_ar,(string *)local_1c0);
      cfd::core::Transaction::AddTxIn((Txid *)&tx,(uint)&gtest_ar,1,(Script *)0xfffffffffffffffe);
      cfd::core::Txid::~Txid((Txid *)&gtest_ar);
      std::__cxx11::string::~string((string *)local_1c0);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              (local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x10e,
               "Expected: tx.AddTxIn( Txid( \"306186bd70e56d820508ed3c9fd656ecb4b4ead0b1502fc3349145df5a15b7e9\"), 1, 4294967294, script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(local_1c0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(local_1c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  local_1c0[0].data_._0_4_ = cfd::core::Transaction::GetTxInCount();
  local_1e8.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"tx.GetTxInCount()","1",(uint *)local_1c0,(int *)&local_1e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_1c0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x10f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1e8,(Message *)local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_1c0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::GetTxIn((uint)&local_98);
      cfd::core::AbstractTxInReference::~AbstractTxInReference(&local_98);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              (local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x110,"Expected: tx.GetTxIn(0) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(local_1c0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(local_1c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::RemoveTxIn((uint)&tx);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              (local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x112,
               "Expected: tx.RemoveTxIn(0) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(local_1c0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(local_1c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  local_1c0[0].data_._0_4_ = cfd::core::Transaction::GetTxInCount();
  local_1e8.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"tx.GetTxInCount()","0",(uint *)local_1c0,(int *)&local_1e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_1c0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x113,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1e8,(Message *)local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_1c0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::core::Transaction::GetTxIn((uint)&local_128);
    cfd::core::AbstractTxInReference::~AbstractTxInReference(&local_128);
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            (local_1c0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
             ,0x114,
             "Expected: tx.GetTxIn(0) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(local_1c0,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper(local_1c0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  cfd::core::Script::~Script(&script);
  cfd::core::Transaction::~Transaction(&tx);
  return;
}

Assistant:

TEST(Transaction, AddTxIn_RemoveTxIn) {
  Transaction tx(exp_version, exp_locktime);

  Script script("1600141c673dd706e05b17e5c9ff033c8619d06098d7ac");
  EXPECT_NO_THROW(
      tx.AddTxIn(
          Txid(
              "306186bd70e56d820508ed3c9fd656ecb4b4ead0b1502fc3349145df5a15b7e9"),
          1, 4294967294, script));
  EXPECT_EQ(tx.GetTxInCount(), 1);
  EXPECT_NO_THROW(tx.GetTxIn(0));

  EXPECT_NO_THROW(tx.RemoveTxIn(0));
  EXPECT_EQ(tx.GetTxInCount(), 0);
  EXPECT_THROW(tx.GetTxIn(0), CfdException);
}